

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Vector<float,_4>_>::VariableStatement
          (VariableStatement<tcu::Vector<float,_4>_> *this,
          VariableP<tcu::Vector<float,_4>_> *variable,ExprP<tcu::Vector<float,_4>_> *value,
          bool isDeclaration)

{
  bool isDeclaration_local;
  ExprP<tcu::Vector<float,_4>_> *value_local;
  VariableP<tcu::Vector<float,_4>_> *variable_local;
  VariableStatement<tcu::Vector<float,_4>_> *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_032d50b0;
  VariableP<tcu::Vector<float,_4>_>::VariableP(&this->m_variable,variable);
  ExprP<tcu::Vector<float,_4>_>::ExprP(&this->m_value,value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}